

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O3

void AM_drawGrid(int color)

{
  double dVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  mline_t ml;
  mline_t local_68;
  double local_48;
  long local_40;
  double local_38;
  
  dVar8 = bmaporgx;
  dVar1 = m_y;
  dVar5 = m_x;
  dVar6 = SQRT(m_h * m_h + m_w * m_w);
  dVar9 = (dVar6 - m_w) * 0.5;
  dVar7 = (dVar6 - m_h) * 0.5;
  local_48 = m_x - dVar9;
  dVar4 = ceil((local_48 - bmaporgx) * 0.0078125);
  dVar8 = dVar4 * 128.0 + dVar8;
  dVar9 = (dVar5 + dVar6) - dVar9;
  lVar2 = (long)color;
  lVar3 = lVar2;
  if (dVar8 < dVar9) {
    dVar5 = dVar1 - dVar7;
    local_38 = dVar6 + dVar5;
    local_40 = lVar2;
    do {
      local_68.b.y = local_38;
      local_68.a.x = dVar8;
      local_68.a.y = dVar5;
      local_68.b.x = dVar8;
      if ((am_rotate.Value == 1) || ((am_rotate.Value == 2 && (viewactive == true)))) {
        AM_rotatePoint((double *)&local_68,&local_68.a.y);
        AM_rotatePoint(&local_68.b.x,&local_68.b.y);
      }
      AM_drawMline(&local_68,AMColors.c + lVar2);
      dVar8 = dVar8 + 128.0;
      lVar3 = local_40;
    } while (dVar8 < dVar9);
  }
  dVar5 = bmaporgy;
  dVar8 = ceil(((dVar1 - dVar7) - bmaporgy) * 0.0078125);
  dVar5 = dVar8 * 128.0 + dVar5;
  dVar7 = (dVar1 + dVar6) - dVar7;
  if (dVar5 < dVar7) {
    dVar6 = dVar6 + local_48;
    do {
      local_68.a.x = local_48;
      local_68.a.y = dVar5;
      local_68.b.x = dVar6;
      local_68.b.y = dVar5;
      if ((am_rotate.Value == 1) || ((am_rotate.Value == 2 && (viewactive == true)))) {
        AM_rotatePoint((double *)&local_68,&local_68.a.y);
        AM_rotatePoint(&local_68.b.x,&local_68.b.y);
      }
      AM_drawMline(&local_68,AMColors.c + lVar3);
      dVar5 = dVar5 + 128.0;
    } while (dVar5 < dVar7);
  }
  return;
}

Assistant:

void AM_drawGrid (int color)
{
	double x, y;
	double start, end;
	mline_t ml;
	double minlen, extx, exty;
	double minx, miny;

	// [RH] Calculate a minimum for how long the grid lines should be so that
	// they cover the screen at any rotation.
	minlen = sqrt (m_w*m_w + m_h*m_h);
	extx = (minlen - m_w) / 2;
	exty = (minlen - m_h) / 2;

	minx = m_x;
	miny = m_y;

	// Figure out start of vertical gridlines
	start = minx - extx;
	start = ceil((start - bmaporgx) / MAPBLOCKUNITS) * MAPBLOCKUNITS + bmaporgx;

	end = minx + minlen - extx;

	// draw vertical gridlines
	for (x = start; x < end; x += MAPBLOCKUNITS)
	{
		ml.a.x = x;
		ml.b.x = x;
		ml.a.y = miny - exty;
		ml.b.y = ml.a.y + minlen;
		if (am_rotate == 1 || (am_rotate == 2 && viewactive))
		{
			AM_rotatePoint (&ml.a.x, &ml.a.y);
			AM_rotatePoint (&ml.b.x, &ml.b.y);
		}
		AM_drawMline(&ml, color);
	}

	// Figure out start of horizontal gridlines
	start = miny - exty;
	start = ceil((start - bmaporgy) / MAPBLOCKUNITS) * MAPBLOCKUNITS + bmaporgy;
	end = miny + minlen - exty;

	// draw horizontal gridlines
	for (y=start; y<end; y+=MAPBLOCKUNITS)
	{
		ml.a.x = minx - extx;
		ml.b.x = ml.a.x + minlen;
		ml.a.y = y;
		ml.b.y = y;
		if (am_rotate == 1 || (am_rotate == 2 && viewactive))
		{
			AM_rotatePoint (&ml.a.x, &ml.a.y);
			AM_rotatePoint (&ml.b.x, &ml.b.y);
		}
		AM_drawMline (&ml, color);
	}
}